

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_assert.cpp
# Opt level: O0

void crnlib_assert(char *pExp,char *pFile,uint line)

{
  bool bVar1;
  char local_228 [8];
  char buf [512];
  uint line_local;
  char *pFile_local;
  char *pExp_local;
  
  sprintf_s(local_228,0x200,"%s(%u): Assertion failed: \"%s\"\n",pFile,(ulong)line,pExp);
  crnlib_output_debug_string(local_228);
  fputs(local_228,_stderr);
  bVar1 = crnlib_is_debugger_present();
  if (bVar1) {
    crnlib_debug_break();
  }
  return;
}

Assistant:

void crnlib_assert(const char* pExp, const char* pFile, unsigned line)
{
    char buf[512];

    sprintf_s(buf, sizeof(buf), "%s(%u): Assertion failed: \"%s\"\n", pFile, line, pExp);

    crnlib_output_debug_string(buf);

    fputs(buf, stderr);

    if (crnlib_is_debugger_present())
    {
        crnlib_debug_break();
    }
}